

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O3

void __thiscall
RandomNumberUtil_GetRandomBytes18_Test::TestBody(RandomNumberUtil_GetRandomBytes18_Test *this)

{
  bool bVar1;
  _Alloc_hider _Var2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  string local_98;
  ByteData local_78;
  char local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  ByteData local_20;
  
  cfd::core::RandomNumberUtil::GetRandomBytes(&local_38,0x12);
  cfd::core::RandomNumberUtil::GetRandomBytes(&local_50,0x12);
  _Var2._M_p = (pointer)(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish +
                        -(long)local_38.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x12;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"bytes.size()","static_cast<size_t>(size)",
             (unsigned_long *)&stack0xffffffffffffff48,(unsigned_long *)&local_78);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff48);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_78,(Message *)&stack0xffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_p !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_p !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)_Var2._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  _Var2._M_p = (pointer)(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish +
                        -(long)local_50.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x12;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"bytes2.size()","static_cast<size_t>(size)",
             (unsigned_long *)&stack0xffffffffffffff48,(unsigned_long *)&local_78);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffff48);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_78,(Message *)&stack0xffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_p !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_p !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)_Var2._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::ByteData(&local_78,&local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_98,&local_78);
  cfd::core::ByteData::ByteData(&local_20,&local_50);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&stack0xffffffffffffff48,&local_20);
  testing::internal::CmpHelperSTRNE
            ((char *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,_Var2._M_p);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_p !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      &stack0xffffffffffffff58) {
    operator_delete(_Var2._M_p);
  }
  if (local_20.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
      &local_98.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p));
  }
  if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60 == '\0') {
    testing::Message::Message((Message *)&local_98);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
    if (CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                       (char)local_98._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytes18) {
  int size = 18;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  std::vector<uint8_t> bytes2 = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
  EXPECT_EQ(bytes2.size(), static_cast<size_t>(size));
  EXPECT_STRNE(ByteData(bytes).GetHex().c_str(),
               ByteData(bytes2).GetHex().c_str());
}